

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

RK_S32 __thiscall mpp_list::add_at_tail(mpp_list *this,void *data,RK_S32 size)

{
  mpp_list_node *_new;
  mpp_list_node *node;
  RK_S32 ret;
  RK_S32 size_local;
  void *data_local;
  mpp_list *this_local;
  
  node._0_4_ = -0x16;
  if (this->head != (mpp_list_node *)0x0) {
    _new = create_list(data,size,0);
    if (_new == (mpp_list_node *)0x0) {
      node._0_4_ = -0xc;
    }
    else {
      mpp_list_add_tail(_new,this->head);
      this->count = this->count + 1;
      node._0_4_ = 0;
    }
  }
  return (RK_S32)node;
}

Assistant:

RK_S32 mpp_list::add_at_tail(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    if (head) {
        mpp_list_node *node = create_list(data, size, 0);
        if (node) {
            mpp_list_add_tail(node, head);
            count++;
            ret = 0;
        } else {
            ret = -ENOMEM;
        }
    }
    return ret;
}